

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

obj * create_oprop(level *lev,obj *otmp,boolean allow_detrimental)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  int candidates [128];
  uint local_238 [130];
  
  if (otmp == (obj *)0x0) {
    uVar4 = 4;
    do {
      lVar5 = 0;
      iVar11 = 0;
      do {
        if (((int)uVar4 <= (int)u.weapon_skills[lVar5 + 1].max_skill) &&
           ((int)uVar4 <= (int)u.weapon_skills[lVar5 + 1].skill)) {
          local_238[iVar11] = (int)lVar5 + 1;
          if (0x7e < iVar11) {
            iVar11 = 0x80;
            goto LAB_00149d27;
          }
          iVar11 = iVar11 + 1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x1c);
      if (iVar11 != 0) {
LAB_00149d27:
        uVar7 = mt_random();
        uVar7 = local_238[SUB168(ZEXT416(uVar7) % SEXT816((long)iVar11),0)];
        switch(uVar7) {
        case 1:
          if (urace.malenum == 0x4a) {
            uVar4 = 0x13;
          }
          else if (urace.malenum == 0x111) {
            uVar4 = 0x12;
          }
          else {
            if (urole.malenum != 0x168) goto switchD_00149d49_caseD_3;
            uVar4 = 0x15;
          }
          break;
        case 2:
          if (urole.malenum != 0x15e) goto switchD_00149d49_caseD_3;
          uVar4 = 0x16;
          break;
        case 3:
        case 4:
switchD_00149d49_caseD_3:
          iVar11 = 0;
          uVar6 = 1;
          lVar5 = 0x3b;
          do {
            bVar1 = *(byte *)((long)&objects->oc_name_idx + lVar5);
            bVar9 = (char)bVar1 >> 7;
            if (uVar7 == (byte)((bVar1 ^ bVar9) - bVar9)) {
              lVar8 = (long)iVar11;
              iVar11 = iVar11 + 1;
              local_238[lVar8] = uVar6;
              if (iVar11 == 0x80) {
                lVar5 = 0x80;
                goto LAB_00149edd;
              }
            }
            uVar6 = uVar6 + 1;
            lVar5 = lVar5 + 0x28;
          } while (lVar5 != 0xb53);
          if (iVar11 == 0) {
            impossible("found no weapons for skill %d?");
            goto LAB_00149ec4;
          }
          lVar5 = (long)iVar11;
LAB_00149edd:
          uVar7 = mt_random();
          uVar4 = local_238[SUB168(ZEXT416(uVar7) % SEXT816(lVar5),0)];
          if (local_238[SUB168(ZEXT416(uVar7) % SEXT816(lVar5),0)] == 0) goto LAB_00149f01;
          break;
        case 5:
          if (urace.malenum == 0x2d) {
            uVar4 = 0x20;
          }
          else if (urace.malenum == 0x4a) {
            uVar4 = 0x1f;
          }
          else if (urace.malenum == 0x111) {
            uVar4 = 0x1e;
          }
          else {
            if (urole.malenum != 0x165) goto switchD_00149d49_caseD_3;
            uVar4 = 0x1d;
          }
          break;
        case 6:
          if (urace.malenum != 0x111) goto switchD_00149d49_caseD_3;
          uVar4 = 0x25;
          break;
        case 7:
          if (urole.malenum != 0x165) goto switchD_00149d49_caseD_3;
          uVar4 = 0x28;
          break;
        case 8:
          if (urole.malenum != 0x165) goto switchD_00149d49_caseD_3;
          uVar4 = 0x29;
          break;
        default:
          if (uVar7 != 0x16) goto switchD_00149d49_caseD_3;
          if (urace.malenum == 0x4a) {
            uVar7 = mt_random();
            uVar6 = 3;
            uVar4 = 0x44;
          }
          else {
            if (urace.malenum != 0x111) {
              if (urole.malenum == 0x165) {
                uVar4 = mt_random();
                uVar4 = (uVar4 & 1) << 6 | 5;
                break;
              }
              goto switchD_00149d49_caseD_3;
            }
            uVar7 = mt_random();
            uVar6 = 2;
            uVar4 = 0x43;
          }
          if ((uVar7 & 1) == 0) {
            uVar4 = uVar6;
          }
        }
        otmp = mksobj(lev,uVar4,'\x01','\0');
        goto LAB_00149f13;
      }
LAB_00149ec4:
      bVar2 = 2 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
LAB_00149f01:
    otmp = mkobj(lev,'\x02','\0');
  }
LAB_00149f13:
  if (allow_detrimental == '\0') {
    if ((otmp->field_0x4a & 1) == 0) {
      bless(otmp);
    }
    else {
      uncurse(otmp);
    }
    if (((byte)otmp->oclass - 2 < 2) ||
       ((otmp->oclass == 4 && ((objects[otmp->otyp].field_0x10 & 0x20) != 0)))) {
      if (otmp->spe < '\0') {
        cVar3 = '\0';
      }
      else {
        if (otmp->spe != '\0') goto LAB_00149f17;
        uVar4 = mt_random();
        cVar3 = ((byte)uVar4 & 1) + 1;
      }
      otmp->spe = cVar3;
    }
  }
LAB_00149f17:
  if (otmp->oartifact != '\0') {
    return otmp;
  }
  if ((objects[otmp->otyp].field_0x10 & 0x40) == 0) {
    cVar3 = otmp->oclass;
    if (cVar3 != '\x02') {
      if (cVar3 == '\x06') {
        if (objects[otmp->otyp].oc_subtyp == '\0') {
          return otmp;
        }
      }
      else if (2 < (byte)(cVar3 - 3U)) {
        return otmp;
      }
    }
    uVar10 = otmp->oprops;
    while ((uVar10 == 0 || (uVar4 = mt_random(), uVar4 * -0x33333333 < 0x33333334))) {
      uVar4 = mt_random();
      uVar7 = 1 << (sbyte)(uVar4 % 0x14);
      uVar10 = otmp->oprops;
      if (((((uint)uVar10 | 8) >> uVar4 % 0x14 & 1) == 0) &&
         ((allow_detrimental != '\0' || ((uVar7 & 0xc8000) == 0)))) {
        lVar5 = restrict_oprops(otmp,(ulong)uVar7);
        uVar10 = uVar10 | (long)(int)lVar5;
        otmp->oprops = uVar10;
      }
    }
    if (((allow_detrimental != '\0') && ((otmp->oprops & 0xc8000U) != 0)) &&
       (uVar4 = mt_random(),
       0x19999999 < (uVar4 * -0x33333333 >> 1 | (uint)((uVar4 * -0x33333333 & 1) != 0) << 0x1f))) {
      curse(otmp);
    }
    return otmp;
  }
  return otmp;
}

Assistant:

struct obj *create_oprop(struct level *lev, struct obj *otmp,
			 boolean allow_detrimental)
{
	if (!otmp) {
	    int type = 0;
	    int skill = P_NONE;
	    int candidates[128];
	    int ccount;
	    int threshold = P_EXPERT;
	    int i;

	    /* This probably is only ever done for weapons, y'know?
	     * Find an appropriate type of weapon */
	    while (threshold > P_UNSKILLED) {
		ccount = 0;
		for (i = P_FIRST_WEAPON; i < P_LAST_WEAPON; i++) {
		    if (P_MAX_SKILL(i) >= max(threshold, P_BASIC) &&
			P_SKILL(i) >= threshold)
			candidates[ccount++] = i;
		    if (ccount >= 128) break;
		}
		if (ccount == 0) {
		    threshold--;
		    continue;
		}
		skill = candidates[rn2(ccount)];
		if ((type = suitable_obj_for_skill(skill)))
		    break;

		ccount = 0;
		for (i = ARROW; i <= CROSSBOW; i++) {
		    if (abs(objects[i].oc_skill) == skill)
			candidates[ccount++] = i;
		    if (ccount == 128) break;
		}
		if (!ccount) {
		    impossible("found no weapons for skill %d?", skill);
		    threshold--;
		    continue;
		}
		type = candidates[rn2(ccount)];
		break;
	    }

	    /* Now make one, if we can */
	    if (type != 0)
		otmp = mksobj(lev, type, TRUE, FALSE);
	    else
		otmp = mkobj(lev, WEAPON_CLASS, FALSE);
	}

	/* Regardless if it's special or not, fix it up as necessary */
	if (!allow_detrimental) {
	    if (otmp->cursed) uncurse(otmp);
	    else bless(otmp);

	    if (otmp->oclass == WEAPON_CLASS ||
		otmp->oclass == ARMOR_CLASS ||
		(otmp->oclass == RING_CLASS && objects[otmp->otyp].oc_charged)) {
		if (otmp->spe < 0) otmp->spe = 0;
		else if (otmp->spe == 0) otmp->spe = rn1(2, 1);
	    }
	}

	/* Don't spruce up artifacts */
	if (otmp->oartifact) return otmp;
	else if (objects[otmp->otyp].oc_unique) return otmp;

	if (otmp->oclass != WEAPON_CLASS && !is_weptool(otmp) &&
	    otmp->oclass != AMULET_CLASS &&
	    otmp->oclass != RING_CLASS &&
	    otmp->oclass != ARMOR_CLASS)
	    return otmp;

	while (!otmp->oprops || !rn2(5)) {
	    int j = 1 << rn2(MAX_ITEM_PROPS); /* pick an item property */

	    if (otmp->oprops & j) continue;

	    /* don't randomly put insta-death weapons in monsters' hands */
	    if (j & ITEM_VORPAL) continue;

	    if ((j & (ITEM_FUMBLING|ITEM_HUNGER|ITEM_AGGRAVATE)) &&
		!allow_detrimental)
		continue;

	    j = restrict_oprops(otmp, j);
	    otmp->oprops |= j;
	}

	if ((otmp->oprops & (ITEM_FUMBLING|ITEM_HUNGER|ITEM_AGGRAVATE)) &&
	    allow_detrimental && rn2(10)) {
	    curse(otmp);
	}

	return otmp;
}